

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O2

void __thiscall cppjieba::FullSegment::FullSegment(FullSegment *this,string *dictPath)

{
  DictTrie *this_00;
  allocator local_39;
  string local_38;
  
  SegmentBase::SegmentBase(&this->super_SegmentBase);
  (this->super_SegmentBase)._vptr_SegmentBase = (_func_int **)&PTR__FullSegment_001766b0;
  this_00 = (DictTrie *)operator_new(0xd0);
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  DictTrie::DictTrie(this_00,dictPath,&local_38,WordWeightMedian);
  this->dictTrie_ = this_00;
  std::__cxx11::string::~string((string *)&local_38);
  this->isNeedDestroy_ = true;
  return;
}

Assistant:

FullSegment(const string& dictPath) {
    dictTrie_ = new DictTrie(dictPath);
    isNeedDestroy_ = true;
  }